

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O0

void __thiscall
oout::SuiteTest::
SuiteTest<oout::Test_const,oout::ContainTest,oout::NamedTest,oout::NamedTest,oout::NamedTest>
          (SuiteTest *this,shared_ptr<const_oout::Test> *test1,shared_ptr<const_oout::Test> *tests,
          shared_ptr<oout::ContainTest> *tests_1,shared_ptr<oout::NamedTest> *tests_2,
          shared_ptr<oout::NamedTest> *tests_3,shared_ptr<oout::NamedTest> *tests_4)

{
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  shared_ptr<const_oout::Test> *local_f8;
  allocator<std::shared_ptr<const_oout::Test>_> local_c1;
  shared_ptr<const_oout::Test> local_c0;
  shared_ptr<const_oout::Test> local_b0;
  shared_ptr<oout::Test_const> local_a0 [16];
  shared_ptr<oout::Test_const> local_90 [16];
  shared_ptr<oout::Test_const> local_80 [16];
  shared_ptr<oout::Test_const> local_70 [16];
  shared_ptr<const_oout::Test> local_60;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_50;
  shared_ptr<oout::NamedTest> *local_38;
  shared_ptr<oout::NamedTest> *tests_local_3;
  shared_ptr<oout::NamedTest> *tests_local_2;
  shared_ptr<oout::ContainTest> *tests_local_1;
  shared_ptr<const_oout::Test> *tests_local;
  shared_ptr<const_oout::Test> *test1_local;
  SuiteTest *this_local;
  
  local_38 = tests_3;
  tests_local_3 = tests_2;
  tests_local_2 = (shared_ptr<oout::NamedTest> *)tests_1;
  tests_local_1 = (shared_ptr<oout::ContainTest> *)tests;
  tests_local = test1;
  test1_local = (shared_ptr<const_oout::Test> *)this;
  std::shared_ptr<const_oout::Test>::shared_ptr(&local_c0,test1);
  std::shared_ptr<const_oout::Test>::shared_ptr
            (&local_b0,(shared_ptr<const_oout::Test> *)tests_local_1);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::ContainTest,void>
            (local_a0,(shared_ptr<oout::ContainTest> *)tests_local_2);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::NamedTest,void>(local_90,tests_local_3);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::NamedTest,void>(local_80,local_38);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::NamedTest,void>(local_70,tests_4);
  local_60.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
  local_60.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_c0;
  std::allocator<std::shared_ptr<const_oout::Test>_>::allocator(&local_c1);
  __l._M_len = (size_type)
               local_60.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  __l._M_array = (iterator)
                 local_60.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            (&local_50,__l,&local_c1);
  SuiteTest(this,&local_50);
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::
  ~list(&local_50);
  std::allocator<std::shared_ptr<const_oout::Test>_>::~allocator(&local_c1);
  local_f8 = &local_60;
  do {
    local_f8 = local_f8 + -1;
    std::shared_ptr<const_oout::Test>::~shared_ptr(local_f8);
  } while (local_f8 != &local_c0);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}